

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

fio_str_info_s * fio_str2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = o & 0xfffffffffffffff8;
  bVar1 = *(byte *)(uVar4 + 0x10);
  if ((bVar1 == 0) && (pcVar2 = *(char **)(uVar4 + 0x38), pcVar2 != (char *)0x0)) {
    if (*(char *)(uVar4 + 0x11) == '\0') {
      sVar3 = *(size_t *)(uVar4 + 0x20);
    }
    else {
      sVar3 = 0;
    }
    __return_storage_ptr__->capa = sVar3;
    __return_storage_ptr__->len = *(size_t *)(uVar4 + 0x28);
    __return_storage_ptr__->data = pcVar2;
    return __return_storage_ptr__;
  }
  sVar3 = 0x2d;
  if (*(char *)(uVar4 + 0x11) != '\0') {
    sVar3 = 0;
  }
  __return_storage_ptr__->capa = sVar3;
  __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
  __return_storage_ptr__->data = (char *)(uVar4 + 0x12);
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_str2str(const FIOBJ o) {
  return fiobj_str_get_cstr(o);
}